

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::IssueMessage(cmake *this,MessageType t,string *text,cmListFileContext *lfc)

{
  bool bVar1;
  ostream *os;
  char *local_1d0;
  undefined1 local_1a0 [8];
  ostringstream msg;
  cmListFileContext *lfc_local;
  string *text_local;
  MessageType t_local;
  cmake *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  bVar1 = PrintMessagePreamble(this,t,(ostream *)local_1a0);
  if (bVar1) {
    if (lfc->Line == 0) {
      local_1d0 = " in ";
    }
    else {
      local_1d0 = " at ";
    }
    os = std::operator<<((ostream *)local_1a0,local_1d0);
    ::operator<<(os,lfc);
    printMessageText((ostream *)local_1a0,text);
    displayMessage(t,(ostringstream *)local_1a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

void cmake::IssueMessage(cmake::MessageType t, std::string const& text,
                         cmListFileContext const& lfc)
{
  std::ostringstream msg;
  if (!this->PrintMessagePreamble(t, msg))
    {
    return;
    }

  // Add the immediate context.
  msg << (lfc.Line ? " at " : " in ") << lfc;

  printMessageText(msg, text);

  displayMessage(t, msg);
}